

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_writer.cc
# Opt level: O1

void __thiscall tcmalloc::GenericWriter::AppendMem(GenericWriter *this,char *str,size_t sz)

{
  char *pcVar1;
  ulong uVar2;
  undefined4 extraout_var;
  int iVar3;
  char *extraout_RDX;
  size_t __n;
  
  while( true ) {
    uVar2 = 0x7fffffff;
    if (sz < 0x7fffffff) {
      uVar2 = sz;
    }
    iVar3 = *(int *)&this->buf_end_ - (int)this->buf_fill_;
    if ((int)uVar2 <= iVar3) {
      iVar3 = (int)uVar2;
    }
    __n = (size_t)iVar3;
    if (iVar3 != 0) {
      memcpy(this->buf_fill_,str,__n);
    }
    pcVar1 = this->buf_fill_;
    this->buf_fill_ = pcVar1 + __n;
    sz = sz - __n;
    if (sz == 0) break;
    str = str + __n;
    iVar3 = (*this->_vptr_GenericWriter[2])(this,this->buf_,pcVar1 + __n,1);
    this->buf_ = (char *)CONCAT44(extraout_var,iVar3);
    this->buf_end_ = extraout_RDX;
    this->buf_fill_ = (char *)CONCAT44(extraout_var,iVar3);
  }
  return;
}

Assistant:

void GenericWriter::AppendMem(const char* str, size_t sz) {
  for (;;) {
    // first, cap amount to be at most MAX_INT
    int amount = static_cast<int>(std::min<size_t>(std::numeric_limits<int>::max(), sz));
    amount = std::min<int>(amount, buf_end_ - buf_fill_);

    // So this is silly but ultimately harmless. Glibc defines memcpy
    // args to be non-null (so, even for the amount == 0 case). And
    // while in practice it works (and has to), ubsan kinda complains.
    //
    // Thankfully in this place we can afford slight perf hit of doing
    // "stupid" thing.
    if (PREDICT_TRUE(amount != 0)) {
      memcpy(buf_fill_, str, amount);
    }

    str += amount;
    buf_fill_ += amount;
    sz -= amount;

    if (sz == 0) {
      return;
    }

    std::tie(buf_, buf_end_) = RecycleBuffer(buf_, buf_fill_, 1);
    buf_fill_ = buf_;
  }
}